

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

float kernel_function(flat_example *fec1,flat_example *fec2,void *params,size_t kernel_type)

{
  long in_RCX;
  flat_example *in_stack_00000030;
  flat_example *in_stack_00000038;
  flat_example *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  if (in_RCX == 0) {
    local_4 = linear_kernel(in_stack_00000038,in_stack_00000030);
  }
  else if (in_RCX == 1) {
    local_4 = rbf_kernel((flat_example *)0x1,in_stack_ffffffffffffffc8,0.0);
  }
  else if (in_RCX == 2) {
    local_4 = poly_kernel((flat_example *)0x2,in_stack_ffffffffffffffc8,0);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float kernel_function(const flat_example* fec1, const flat_example* fec2, void* params, size_t kernel_type)
{
  switch (kernel_type)
  {
    case SVM_KER_RBF:
      return rbf_kernel(fec1, fec2, *((float*)params));
    case SVM_KER_POLY:
      return poly_kernel(fec1, fec2, *((int*)params));
    case SVM_KER_LIN:
      return linear_kernel(fec1, fec2);
  }
  return 0;
}